

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ddac71::AV1LbdInvTxfm2d_gt_int16_Test::TestBody
          (AV1LbdInvTxfm2d_gt_int16_Test *this)

{
  TxSetType tx_set_type;
  int iVar1;
  uint8_t i;
  long lVar2;
  int j;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    iVar1 = (uint)((0x18608UL >> (uVar3 & 0x3f) & 1) == 0) * 4 + 1;
    if ((0x61810UL >> (uVar3 & 0x3f) & 1) != 0) {
      iVar1 = 0;
    }
    lVar2 = 0;
    do {
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)""[lVar2] * 4 + (ulong)(uint)(iVar1 << 6)) != 0
         ) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (&this->super_AV1LbdInvTxfm2d,""[lVar2],(TxSize)uVar3,1,1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x13);
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, gt_int16) {
  static const TxType types[] = { DCT_DCT, ADST_DCT, FLIPADST_DCT, IDTX,
                                  V_DCT,   H_DCT,    H_ADST,       H_FLIPADST };
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    const TxSize sz = static_cast<TxSize>(j);
    for (uint8_t i = 0; i < sizeof(types) / sizeof(types[0]); ++i) {
      const TxType tp = types[i];
      if (libaom_test::IsTxSizeTypeValid(sz, tp)) {
        RunAV1InvTxfm2dTest(tp, sz, 1, 1);
      }
    }
  }
}